

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::TextGenerator
          (TextGenerator *this,ZeroCopyOutputStream *output,int initial_indent_level)

{
  allocator local_1d;
  int local_1c;
  ZeroCopyOutputStream *pZStack_18;
  int initial_indent_level_local;
  ZeroCopyOutputStream *output_local;
  TextGenerator *this_local;
  
  this->output_ = output;
  this->buffer_ = (char *)0x0;
  this->buffer_size_ = 0;
  this->at_start_of_line_ = true;
  this->failed_ = false;
  local_1c = initial_indent_level;
  pZStack_18 = output;
  output_local = (ZeroCopyOutputStream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->indent_,"",&local_1d);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  this->initial_indent_level_ = local_1c;
  std::__cxx11::string::resize((ulong)&this->indent_,(char)this->initial_indent_level_ * '\x02');
  return;
}

Assistant:

explicit TextGenerator(io::ZeroCopyOutputStream* output,
                         int initial_indent_level)
    : output_(output),
      buffer_(NULL),
      buffer_size_(0),
      at_start_of_line_(true),
      failed_(false),
      indent_(""),
      initial_indent_level_(initial_indent_level) {
    indent_.resize(initial_indent_level_ * 2, ' ');
  }